

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void cpacr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = env->features;
  if (((uint)uVar4 >> 0x1b & 1) == 0) {
    uVar3 = 0;
    uVar2 = extract32((uint32_t)env[1].xregs[0xd],0,4);
    if (uVar2 != 0) {
      uVar4 = (ulong)(((uint)env->features & 0x100) << 0x17) ^ 0x80000000 | value;
      uVar2 = extract32((uint32_t)env[1].xregs[0xd],0,4);
      value = uVar4 | 0x40000000;
      if (1 < uVar2) {
        value = uVar4;
      }
      uVar3 = 0xc0f00000;
    }
    value = (uint64_t)((uint)value & uVar3);
    uVar4 = env->features;
  }
  if ((uVar4 & 0x210000000) == 0x200000000) {
    _Var1 = arm_is_secure(env);
    if (!_Var1) {
      uVar2 = extract32((env->cp15).nsacr,10,1);
      if (uVar2 == 0) {
        value = value & 0xffffffffff0fffff | (ulong)((uint)(env->cp15).cpacr_el1 & 0xf00000);
      }
    }
  }
  (env->cp15).cpacr_el1 = value;
  return;
}

Assistant:

static void cpacr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    uint32_t mask = 0;

    /* In ARMv8 most bits of CPACR_EL1 are RES0. */
    if (!arm_feature(env, ARM_FEATURE_V8)) {
        /* ARMv7 defines bits for unimplemented coprocessors as RAZ/WI.
         * ASEDIS [31] and D32DIS [30] are both UNK/SBZP without VFP.
         * TRCDIS [28] is RAZ/WI since we do not implement a trace macrocell.
         */
        if (cpu_isar_feature(aa32_vfp_simd, env_archcpu(env))) {
            /* VFP coprocessor: cp10 & cp11 [23:20] */
            mask |= (1UL << 31) | (1 << 30) | (0xf << 20);

            if (!arm_feature(env, ARM_FEATURE_NEON)) {
                /* ASEDIS [31] bit is RAO/WI */
                value |= (1UL << 31);
            }

            /* VFPv3 and upwards with NEON implement 32 double precision
             * registers (D0-D31).
             */
            if (!cpu_isar_feature(aa32_simd_r32, env_archcpu(env))) {
                /* D32DIS [30] is RAO/WI if D16-31 are not implemented. */
                value |= (1 << 30);
            }
        }
        value &= mask;
    }

    /*
     * For A-profile AArch32 EL3 (but not M-profile secure mode), if NSACR.CP10
     * is 0 then CPACR.{CP11,CP10} ignore writes and read as 0b00.
     */
    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value &= ~(0xf << 20);
        value |= env->cp15.cpacr_el1 & (0xf << 20);
    }

    env->cp15.cpacr_el1 = value;
}